

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Matchers::Floating::WithinRelMatcher::WithinRelMatcher
          (WithinRelMatcher *this,double target,double epsilon)

{
  ReusableStringStream local_50;
  string local_38;
  
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.field_2
  ;
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString._M_string_length = 0;
  (this->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.field_2._M_local_buf
  [0] = '\0';
  (this->super_MatcherBase<double>).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_001bf3c8;
  (this->super_MatcherBase<double>).super_MatcherMethod<double>._vptr_MatcherMethod =
       (_func_int **)&DAT_001bf3f8;
  this->m_target = target;
  this->m_epsilon = epsilon;
  if (epsilon < 0.0) {
    ReusableStringStream::ReusableStringStream(&local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_50.m_oss,"Relative comparison with epsilon <  0 does not make sense.",0x3a);
    std::__cxx11::stringbuf::str();
    throw_domain_error(&local_38);
  }
  if (epsilon < 1.0) {
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_50.m_oss,"Relative comparison with epsilon >= 1 does not make sense.",0x3a);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_38);
}

Assistant:

WithinRelMatcher::WithinRelMatcher(double target, double epsilon):
        m_target(target),
        m_epsilon(epsilon){
        CATCH_ENFORCE(m_epsilon >= 0., "Relative comparison with epsilon <  0 does not make sense.");
        CATCH_ENFORCE(m_epsilon  < 1., "Relative comparison with epsilon >= 1 does not make sense.");
    }